

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::ProcessKills(GlobOpt *this,Instr *instr)

{
  GlobOptBlockData *this_00;
  Instr *instr_local;
  GlobOpt *this_local;
  
  if (instr->m_opcode == Yield) {
    this_00 = CurrentBlockData(this);
    GlobOptBlockData::KillStateForGeneratorYield(this_00,instr);
  }
  ProcessFieldKills(this,instr);
  ProcessValueKills(this,instr);
  ProcessArrayValueKills(this,instr);
  return;
}

Assistant:

void
GlobOpt::ProcessKills(IR::Instr *instr)
{
    if (instr->m_opcode == Js::OpCode::Yield)
    {
        this->CurrentBlockData()->KillStateForGeneratorYield(instr);
    }
    this->ProcessFieldKills(instr);
    this->ProcessValueKills(instr);
    this->ProcessArrayValueKills(instr);
}